

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall QMessageBoxPrivate::buttonClicked(QMessageBoxPrivate *this,QAbstractButton *button)

{
  bool bVar1;
  QMessageBoxPrivate *this_00;
  QPointer<QObject> *this_01;
  QObject *pQVar2;
  char *pcVar3;
  DetailButton *in_RSI;
  QMessageBoxPrivate *in_RDI;
  QMessageBox *q;
  undefined8 in_stack_ffffffffffffffb8;
  undefined1 hidden;
  QWidget *in_stack_ffffffffffffffc0;
  QAbstractButton *in_stack_ffffffffffffffc8;
  QMessageBoxPrivate *in_stack_ffffffffffffffd0;
  DetailButton *this_02;
  
  hidden = (undefined1)((ulong)in_stack_ffffffffffffffb8 >> 0x38);
  this_00 = (QMessageBoxPrivate *)q_func(in_RDI);
  if (((in_RDI->detailsButton == (DetailButton *)0x0) ||
      (in_RDI->detailsText == (QMessageBoxDetailsText *)0x0)) || (in_RSI != in_RDI->detailsButton))
  {
    setClickedButton(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QObject> *)0x7a3246);
    if (bVar1) {
      this_01 = (QPointer<QObject> *)QByteArray::operator_cast_to_char_((QByteArray *)0x7a3266);
      pQVar2 = ::QPointer::operator_cast_to_QObject_((QPointer<QObject> *)0x7a327c);
      pcVar3 = QByteArray::operator_cast_to_char_((QByteArray *)0x7a3292);
      QObject::disconnect((QObject *)this_00,(char *)this_01,pQVar2,pcVar3);
      QPointer<QObject>::operator=(this_01,(QObject *)this_00);
    }
    QByteArray::clear();
    QByteArray::clear();
  }
  else {
    this_02 = in_RDI->detailsButton;
    QWidget::isHidden((QWidget *)0x7a31cf);
    DetailButton::setLabel(this_02,(DetailButtonLabel)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    QWidget::isHidden((QWidget *)0x7a3205);
    QWidget::setHidden(in_stack_ffffffffffffffc0,(bool)hidden);
    updateSize(this_00);
  }
  return;
}

Assistant:

void QMessageBoxPrivate::buttonClicked(QAbstractButton *button)
{
    Q_Q(QMessageBox);
#if QT_CONFIG(textedit)
    if (detailsButton && detailsText && button == detailsButton) {
        detailsButton->setLabel(detailsText->isHidden() ? HideLabel : ShowLabel);
        detailsText->setHidden(!detailsText->isHidden());
        updateSize();
    } else
#endif
    {
        setClickedButton(button);

        if (receiverToDisconnectOnClose) {
            QObject::disconnect(q, signalToDisconnectOnClose, receiverToDisconnectOnClose,
                                memberToDisconnectOnClose);
            receiverToDisconnectOnClose = nullptr;
        }
        signalToDisconnectOnClose.clear();
        memberToDisconnectOnClose.clear();
    }
}